

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createdfd.c
# Opt level: O2

uint32_t *
createDFD422(int bigEndian,int numSamples,int *bits,int *shiftBits,int *channels,int *position_xs,
            int *position_ys,VkSuffix suffix)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uint32_t *puVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  
  if (bigEndian != 0) {
    __assert_fail("!bigEndian",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/dfdutils/createdfd.c"
                  ,0x194,
                  "uint32_t *createDFD422(int, int, int *, int *, int *, int *, int *, enum VkSuffix)"
                 );
  }
  if (suffix == s_UNORM) {
    uVar3 = 0;
    uVar6 = 0;
    if (0 < numSamples) {
      uVar6 = (ulong)(uint)numSamples;
    }
    uVar8 = 0;
    for (; uVar6 != uVar3; uVar3 = uVar3 + 1) {
      uVar8 = uVar8 + shiftBits[uVar3] + bits[uVar3];
    }
    if ((uVar8 & 7) == 0) {
      uVar2 = numSamples * 0x10 + 0x1c;
      puVar4 = (uint32_t *)calloc(1,(ulong)uVar2);
      *puVar4 = uVar2;
      puVar4[2] = numSamples * 0x100000 + 0x180002;
      puVar4[3] = 0x10002;
      puVar4[4] = 1;
      puVar4[5] = uVar8 >> 3 & 0xff;
      iVar7 = 0;
      for (lVar5 = 0; uVar6 * 4 != lVar5; lVar5 = lVar5 + 4) {
        uVar8 = iVar7 + *(int *)((long)shiftBits + lVar5);
        iVar1 = *(int *)((long)bits + lVar5);
        puVar4[lVar5 + 7] =
             (*(uint *)((long)channels + lVar5) & 0xf) << 0x18 | uVar8 & 0xffff |
             iVar1 * 0x10000 + 0xff0000U & 0xff0000;
        puVar4[lVar5 + 8] =
             (*(uint *)((long)position_ys + lVar5) & 0xff) << 8 |
             (uint)*(byte *)((long)position_xs + lVar5);
        puVar4[lVar5 + 9] = 0;
        iVar7 = uVar8 + iVar1;
        puVar4[lVar5 + 10] = ~(-1 << ((byte)iVar1 & 0x1f));
      }
      return puVar4;
    }
    __assert_fail("totalBits % 8 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/dfdutils/createdfd.c"
                  ,0x19a,
                  "uint32_t *createDFD422(int, int, int *, int *, int *, int *, int *, enum VkSuffix)"
                 );
  }
  __assert_fail("suffix == s_UNORM",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/dfdutils/createdfd.c"
                ,0x195,
                "uint32_t *createDFD422(int, int, int *, int *, int *, int *, int *, enum VkSuffix)"
               );
}

Assistant:

uint32_t *createDFD422(int bigEndian, int numSamples,
                       int bits[], int shiftBits[], int channels[],
                       int position_xs[], int position_ys[],
                       enum VkSuffix suffix) {
    assert(!bigEndian); (void) bigEndian;
    assert(suffix == s_UNORM); (void) suffix;

    int totalBits = 0;
    for (int i = 0; i < numSamples; ++i)
        totalBits += shiftBits[i] + bits[i];
    assert(totalBits % 8 == 0);

    uint32_t BDFDSize = sizeof(uint32_t) * (KHR_DF_WORD_SAMPLESTART + numSamples * KHR_DF_WORD_SAMPLEWORDS);
    uint32_t DFDSize = sizeof(uint32_t) + BDFDSize;
    uint32_t *DFD = (uint32_t *) malloc(DFDSize);
    memset(DFD, 0, DFDSize);
    DFD[0] = DFDSize;
    uint32_t *BDFD = DFD + 1;
    KHR_DFDSETVAL(BDFD, VENDORID, KHR_DF_VENDORID_KHRONOS);
    KHR_DFDSETVAL(BDFD, DESCRIPTORTYPE, KHR_DF_KHR_DESCRIPTORTYPE_BASICFORMAT);
    KHR_DFDSETVAL(BDFD, VERSIONNUMBER, KHR_DF_VERSIONNUMBER_LATEST);
    KHR_DFDSETVAL(BDFD, DESCRIPTORBLOCKSIZE, BDFDSize);
    KHR_DFDSETVAL(BDFD, MODEL, KHR_DF_MODEL_YUVSDA);
    KHR_DFDSETVAL(BDFD, PRIMARIES, KHR_DF_PRIMARIES_UNSPECIFIED);
    KHR_DFDSETVAL(BDFD, TRANSFER, KHR_DF_TRANSFER_LINEAR);
    KHR_DFDSETVAL(BDFD, FLAGS, KHR_DF_FLAG_ALPHA_STRAIGHT);
    KHR_DFDSETVAL(BDFD, TEXELBLOCKDIMENSION0, 2 - 1); // 422 contains 2 x 1 blocks
    KHR_DFDSETVAL(BDFD, TEXELBLOCKDIMENSION1, 1 - 1);
    KHR_DFDSETVAL(BDFD, TEXELBLOCKDIMENSION2, 1 - 1);
    KHR_DFDSETVAL(BDFD, TEXELBLOCKDIMENSION3, 1 - 1);
    KHR_DFDSETVAL(BDFD, BYTESPLANE0, totalBits / 8);
    KHR_DFDSETVAL(BDFD, BYTESPLANE1, 0);
    KHR_DFDSETVAL(BDFD, BYTESPLANE2, 0);
    KHR_DFDSETVAL(BDFD, BYTESPLANE3, 0);
    KHR_DFDSETVAL(BDFD, BYTESPLANE4, 0);
    KHR_DFDSETVAL(BDFD, BYTESPLANE5, 0);
    KHR_DFDSETVAL(BDFD, BYTESPLANE6, 0);
    KHR_DFDSETVAL(BDFD, BYTESPLANE7, 0);

    int bitOffset = 0;
    for (int i = 0; i < numSamples; ++i) {
        bitOffset += shiftBits[i];
        KHR_DFDSETSVAL(BDFD, i, BITOFFSET, bitOffset);
        KHR_DFDSETSVAL(BDFD, i, BITLENGTH, bits[i] - 1);
        KHR_DFDSETSVAL(BDFD, i, CHANNELID, channels[i]);
        KHR_DFDSETSVAL(BDFD, i, QUALIFIERS, 0); // None of: FLOAT, SIGNED, EXPONENT, LINEAR
        KHR_DFDSETSVAL(BDFD, i, SAMPLEPOSITION0, position_xs[i]);
        KHR_DFDSETSVAL(BDFD, i, SAMPLEPOSITION1, position_ys[i]);
        KHR_DFDSETSVAL(BDFD, i, SAMPLEPOSITION2, 0);
        KHR_DFDSETSVAL(BDFD, i, SAMPLEPOSITION3, 0);
        KHR_DFDSETSVAL(BDFD, i, SAMPLELOWER, 0);
        KHR_DFDSETSVAL(BDFD, i, SAMPLEUPPER, (1u << bits[i]) - 1u);
        bitOffset += bits[i];
    }

    return DFD;
}